

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O1

Vec_Int_t * Emb_ManConnectedComponents(Emb_Man_t *p)

{
  int iVar1;
  Vec_Int_t *p_00;
  int *piVar2;
  Vec_Int_t *p_01;
  Vec_Int_t *vNext;
  Gia_Man_t *pGVar3;
  Vec_Int_t *pVVar4;
  ulong uVar5;
  long lVar6;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  piVar2 = (int *)malloc(4000);
  p_00->pArray = piVar2;
  p_01 = (Vec_Int_t *)malloc(0x10);
  p_01->nCap = 1000;
  p_01->nSize = 0;
  piVar2 = (int *)malloc(4000);
  p_01->pArray = piVar2;
  vNext = (Vec_Int_t *)malloc(0x10);
  vNext->nCap = 1000;
  vNext->nSize = 0;
  piVar2 = (int *)malloc(4000);
  vNext->pArray = piVar2;
  p->nReached = 0;
  p->nTravIds = p->nTravIds + 1;
  pGVar3 = p->pGia;
  pVVar4 = pGVar3->vCos;
  if (0 < pVVar4->nSize) {
    lVar6 = 0;
    do {
      iVar1 = pVVar4->pArray[lVar6];
      if (((long)iVar1 < 0) || (pGVar3->nObjs <= iVar1)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGVar3->pObjs == (Gia_Obj_t *)0x0) break;
      uVar5 = (ulong)pGVar3->pObjs[iVar1].Value;
      piVar2 = p->pObjData;
      if (piVar2[uVar5 + 3] != p->nTravIds) {
        piVar2[uVar5 + 3] = p->nTravIds;
        Vec_IntPush(p_00,piVar2[uVar5 + 2]);
        p_01->nSize = 0;
        Vec_IntPush(p_01,piVar2[uVar5 + 2]);
        Emb_ManPerformBfs(p,p_01,vNext,(Emb_Dat_t *)0x0);
      }
      lVar6 = lVar6 + 1;
      pGVar3 = p->pGia;
      pVVar4 = pGVar3->vCos;
    } while (lVar6 < pVVar4->nSize);
  }
  if (p_01->pArray != (int *)0x0) {
    free(p_01->pArray);
    p_01->pArray = (int *)0x0;
  }
  free(p_01);
  if (vNext->pArray != (int *)0x0) {
    free(vNext->pArray);
    vNext->pArray = (int *)0x0;
  }
  free(vNext);
  return p_00;
}

Assistant:

Vec_Int_t * Emb_ManConnectedComponents( Emb_Man_t * p )
{
    Gia_Obj_t * pObj;
    Vec_Int_t * vThis, * vNext, * vResult;
    Emb_Obj_t * pThis;
    int i;
    vResult = Vec_IntAlloc( 1000 );
    vThis   = Vec_IntAlloc( 1000 );
    vNext   = Vec_IntAlloc( 1000 );
    p->nReached = 0;
    Emb_ManIncrementTravId( p );
    Gia_ManForEachCo( p->pGia, pObj, i )
    {
        pThis = Emb_ManObj( p, Gia_ObjValue(pObj) );
        if ( Emb_ObjIsTravIdCurrent(p, pThis) )
            continue;
        Emb_ObjSetTravIdCurrent( p, pThis );
        Vec_IntPush( vResult, pThis->hHandle );
        // perform BFS from this node
        Vec_IntClear( vThis );
        Vec_IntPush( vThis, pThis->hHandle );
        Emb_ManPerformBfs( p, vThis, vNext, NULL ); 
    }
    Vec_IntFree( vThis );
    Vec_IntFree( vNext );
    return vResult;
}